

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

bool __thiscall ON_Matrix::Add(ON_Matrix *this,ON_Matrix *a,ON_Matrix *b)

{
  int row_count;
  uint uVar1;
  uint uVar2;
  double **ppdVar3;
  double **ppdVar4;
  double **ppdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  bool bVar9;
  double ***pppdVar10;
  double ***pppdVar11;
  double ***pppdVar12;
  ulong uVar13;
  ulong uVar14;
  
  bVar9 = false;
  if ((((a->m_col_count == b->m_col_count) && (bVar9 = false, 0 < a->m_col_count)) &&
      (row_count = a->m_row_count, bVar9 = false, 0 < row_count)) && (row_count == b->m_row_count))
  {
    if (this != b && this != a) {
      Create(this,row_count,b->m_col_count);
    }
    pppdVar10 = &a->m;
    if (a->m_row_count == (a->m_rowmem).m_count) {
      pppdVar10 = &(a->m_rowmem).m_a;
    }
    pppdVar11 = &b->m;
    if (b->m_row_count == (b->m_rowmem).m_count) {
      pppdVar11 = &(b->m_rowmem).m_a;
    }
    uVar1 = this->m_row_count;
    pppdVar12 = &this->m;
    if (uVar1 == (this->m_rowmem).m_count) {
      pppdVar12 = &(this->m_rowmem).m_a;
    }
    bVar9 = true;
    if (0 < (int)uVar1) {
      ppdVar3 = *pppdVar10;
      ppdVar4 = *pppdVar11;
      ppdVar5 = *pppdVar12;
      uVar2 = this->m_col_count;
      uVar13 = 0;
      do {
        if (0 < (int)uVar2) {
          pdVar6 = ppdVar3[uVar13];
          pdVar7 = ppdVar4[uVar13];
          pdVar8 = ppdVar5[uVar13];
          uVar14 = 0;
          do {
            pdVar8[uVar14] = pdVar6[uVar14] + pdVar7[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar2 != uVar14);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar1);
    }
  }
  return bVar9;
}

Assistant:

bool ON_Matrix::Add( const ON_Matrix& a, const ON_Matrix& b )
{
  int i, j;
  if (a.ColCount() != b.ColCount() )
    return false;
  if (a.RowCount() != b.RowCount() )
    return false;
  if ( a.RowCount() < 1 || a.ColCount() < 1 )
    return false;
  if ( this != &a && this != &b ) {
    Create( a.RowCount(), b.ColCount() );
  }
  double const*const* am = a.ThisM();
  double const*const* bm = b.ThisM();
  double** this_m = ThisM();
  for ( i = 0; i < m_row_count; i++ ) for ( j = 0; j < m_col_count; j++ ) {
    this_m[i][j] = am[i][j] + bm[i][j];
  }
  return true;  
}